

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::hugeint_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::hugeint_t>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  hugeint_t *in_RDI;
  long in_R8;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *unaff_retaddr;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  hugeint_t *rdata_1;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata_1;
  AggregateFinalizeData finalize_data;
  hugeint_t *rdata;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **sdata;
  ulong local_80;
  AggregateFinalizeData local_78;
  hugeint_t *local_60;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **local_58;
  AggregateFinalizeData local_50;
  hugeint_t *local_38;
  QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> **local_30;
  long local_28;
  ulong local_20;
  Vector *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  VVar1 = Vector::GetVectorType((Vector *)in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::
               GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xadc630);
    local_38 = ConstantVector::GetData<duckdb::hugeint_t>((Vector *)0xadc63f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,in_RSI);
    MedianAbsoluteDeviationOperation<duckdb::hugeint_t>::
    Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
              (unaff_retaddr,in_RDI,(AggregateFinalizeData *)in_RSI);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::
               GetData<duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>*>
                         ((Vector *)0xadc68d);
    local_60 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xadc69c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,in_RSI);
    for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
      local_78.result_idx = local_80 + local_28;
      MedianAbsoluteDeviationOperation<duckdb::hugeint_t>::
      Finalize<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>>
                (unaff_retaddr,in_RDI,(AggregateFinalizeData *)in_RSI);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}